

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String testing::internal::GetCurrentOsStackTraceExceptTop(UnitTest *param_1,int skip_count)

{
  UnitTestImpl *pUVar1;
  String SVar2;
  int skip_count_local;
  UnitTest *param_0_local;
  
  pUVar1 = GetUnitTestImpl();
  SVar2 = UnitTestImpl::CurrentOsStackTraceExceptTop((UnitTestImpl *)param_1,(int)pUVar1);
  SVar2.c_str_ = (char *)param_1;
  return SVar2;
}

Assistant:

String GetCurrentOsStackTraceExceptTop(UnitTest* /*unit_test*/,
                                       int skip_count) {
  // We pass skip_count + 1 to skip this wrapper function in addition
  // to what the user really wants to skip.
  return GetUnitTestImpl()->CurrentOsStackTraceExceptTop(skip_count + 1);
}